

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O2

void al_fill_silence(void *buf,uint samples,ALLEGRO_AUDIO_DEPTH depth,ALLEGRO_CHANNEL_CONF chan_conf
                    )

{
  size_t sVar1;
  ulong uVar2;
  ulong __n;
  uint16_t *buffer;
  int __c;
  
  sVar1 = al_get_audio_depth_size(depth);
  if (ALLEGRO_AUDIO_DEPTH_UINT24 < depth) {
    return;
  }
  __n = samples * sVar1 * (ulong)((chan_conf >> 4) * -0xf + chan_conf);
  switch(depth) {
  default:
    __c = 0;
    goto LAB_00106c64;
  case 4:
  case 5:
  case 6:
  case 7:
    break;
  case ALLEGRO_AUDIO_DEPTH_UINT8:
    __c = 0x80;
LAB_00106c64:
    memset(buf,__c,__n);
    return;
  case ALLEGRO_AUDIO_DEPTH_UINT16:
    for (uVar2 = 0; __n >> 1 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined2 *)((long)buf + uVar2 * 2) = 0x8000;
    }
    break;
  case ALLEGRO_AUDIO_DEPTH_UINT24:
    for (uVar2 = 0; __n >> 2 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)buf + uVar2 * 4) = 0x800000;
    }
  }
  return;
}

Assistant:

void al_fill_silence(void *buf, unsigned int samples,
   ALLEGRO_AUDIO_DEPTH depth, ALLEGRO_CHANNEL_CONF chan_conf)
{
   size_t bytes = samples * al_get_audio_depth_size(depth) *
      al_get_channel_count(chan_conf);

   switch (depth) {
      case ALLEGRO_AUDIO_DEPTH_INT8:
      case ALLEGRO_AUDIO_DEPTH_INT16:
      case ALLEGRO_AUDIO_DEPTH_INT24:
      case ALLEGRO_AUDIO_DEPTH_FLOAT32:
         memset(buf, 0, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT8:
         memset(buf, 0x80, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT16:
         {
            uint16_t *buffer = buf;
            size_t n = bytes / sizeof(uint16_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x8000;
         }
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT24:
         {
            uint32_t *buffer = buf;
            size_t n = bytes / sizeof(uint32_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x800000;
         }
         break;
      default:
         ASSERT(false);
         break;
   }
}